

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.c
# Opt level: O0

void pnga_pgroup_gop(Integer p_grp,Integer type,void *x,Integer n,char *op)

{
  ARMCI_Group *group_00;
  double *in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  int group;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  undefined4 in_stack_ffffffffffffffd0;
  int n_00;
  undefined4 local_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (in_RDI < 1) {
    pnga_gop(in_RSI,in_RDX,(Integer)in_RCX,in_R8);
  }
  else {
    local_8 = (undefined4)in_RDI;
    group_00 = (ARMCI_Group *)(in_RSI + -0x3e9);
    n_00 = (int)((ulong)in_R8 >> 0x20);
    switch(group_00) {
    case (ARMCI_Group *)0x0:
      armci_msg_group_igop
                ((int *)in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00);
      break;
    case (ARMCI_Group *)0x1:
      armci_msg_group_lgop
                ((long *)in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00);
      break;
    case (ARMCI_Group *)0x2:
      armci_msg_group_fgop
                ((float *)in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00);
      break;
    case (ARMCI_Group *)0x3:
      armci_msg_group_dgop(in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00)
      ;
      break;
    default:
      pnga_error(in_stack_00000170,in_stack_00000168);
      break;
    case (ARMCI_Group *)0x5:
      armci_msg_group_fgop
                ((float *)in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00);
      break;
    case (ARMCI_Group *)0x6:
      armci_msg_group_dgop(in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),group_00)
      ;
      break;
    case (ARMCI_Group *)0xf:
      armci_msg_group_llgop
                ((longlong *)in_RCX,n_00,(char *)CONCAT44(local_8,in_stack_ffffffffffffffd0),
                 group_00);
    }
  }
  return;
}

Assistant:

void pnga_pgroup_gop(Integer p_grp, Integer type, void *x, Integer n, char *op)
{
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if (p_grp > 0) {
#if defined(MSG_COMMS_MPI)
        int group = (int)p_grp;
        switch (type){
            case C_INT:
                armci_msg_group_igop((int*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_LONG:
                armci_msg_group_lgop((long*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_LONGLONG:
                armci_msg_group_llgop((long long*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_FLOAT:
                armci_msg_group_fgop((float*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_DBL:
                armci_msg_group_dgop((double*)x, n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_SCPL:
                armci_msg_group_fgop((float*)x, 2*n, op, (&(PGRP_LIST[group].group)));
                break;
            case C_DCPL:
                armci_msg_group_dgop((double*)x, 2*n, op, (&(PGRP_LIST[group].group)));
                break;
            default: pnga_error(" wrong data type ",type);
        }
#else
        pnga_error("Groups not implemented for system",0);
#endif
    } else {
        pnga_gop(type, x, n, op);
    }
}